

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadEXRFromMemory(float *out_rgba,uchar *memory,char **err)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  EXRImage exr_image;
  EXRVersion exr_version;
  EXRHeader exr_header;
  EXRImage EStack_108e8;
  EXRVersion EStack_108bc;
  EXRHeader EStack_108a8;
  
  if (out_rgba == (float *)0x0 || memory == (uchar *)0x0) {
    if (err != (char **)0x0) {
      *err = "Invalid argument.\n";
      return -3;
    }
    return -3;
  }
  memset(&EStack_108a8,0,0x10890);
  iVar6 = ParseEXRVersionFromMemory(&EStack_108bc,memory);
  if (iVar6 != 0) {
    return iVar6;
  }
  iVar6 = ParseEXRHeaderFromMemory(&EStack_108a8,&EStack_108bc,memory,err);
  if (iVar6 != 0) {
    return iVar6;
  }
  EStack_108e8.width = 0;
  EStack_108e8.height = 0;
  EStack_108e8.num_channels = 0;
  EStack_108e8.tiles = (EXRTile *)0x0;
  EStack_108e8.images._0_4_ = 0;
  EStack_108e8.images._4_4_ = 0;
  iVar6 = LoadEXRImageFromMemory(&EStack_108e8,&EStack_108a8,memory,err);
  if (iVar6 != 0) {
    return iVar6;
  }
  if (0 < (long)EStack_108a8.num_channels) {
    pcVar11 = (EStack_108a8.channels)->name + 1;
    uVar8 = 0xffffffff;
    uVar12 = 0;
    uVar7 = 0xffffffff;
    uVar9 = 0xffffffff;
    uVar10 = 0xffffffff;
    do {
      cVar1 = ((EXRChannelInfo *)(pcVar11 + -1))->name[0];
      if (cVar1 == 'R') {
        if (*pcVar11 == '\0') {
          uVar10 = uVar12 & 0xffffffff;
        }
      }
      else if (cVar1 == 'A') {
        if (*pcVar11 == '\0') {
          uVar8 = uVar12 & 0xffffffff;
        }
      }
      else if (cVar1 == 'B') {
        if (*pcVar11 == '\0') {
          uVar7 = uVar12 & 0xffffffff;
        }
      }
      else if ((cVar1 == 'G') && (*pcVar11 == '\0')) {
        uVar9 = uVar12 & 0xffffffff;
      }
      uVar12 = uVar12 + 1;
      pcVar11 = pcVar11 + 0x110;
    } while ((long)EStack_108a8.num_channels != uVar12);
    if ((int)uVar10 != -1) {
      if ((int)uVar9 == -1) {
        if (err == (char **)0x0) {
          return -4;
        }
        pcVar11 = "G channel not found\n";
      }
      else {
        if ((int)uVar7 != -1) {
          if (EStack_108e8.height * EStack_108e8.width < 1) {
            return 0;
          }
          lVar5 = CONCAT44(EStack_108e8.images._4_4_,EStack_108e8.images._0_4_);
          lVar2 = *(long *)(lVar5 + (long)(int)uVar10 * 8);
          lVar3 = *(long *)(lVar5 + (long)(int)uVar9 * 8);
          lVar4 = *(long *)(lVar5 + (long)(int)uVar7 * 8);
          lVar13 = 0;
          do {
            out_rgba[lVar13] = *(float *)(lVar2 + lVar13);
            out_rgba[lVar13 + 1] = *(float *)(lVar3 + lVar13);
            out_rgba[lVar13 + 2] = *(float *)(lVar4 + lVar13);
            fVar14 = 1.0;
            if (0 < (int)uVar8) {
              fVar14 = *(float *)(*(long *)(lVar5 + uVar8 * 8) + lVar13);
            }
            out_rgba[lVar13 + 3] = fVar14;
            lVar13 = lVar13 + 4;
          } while ((ulong)(uint)(EStack_108e8.height * EStack_108e8.width) << 2 != lVar13);
          return 0;
        }
        if (err == (char **)0x0) {
          return -4;
        }
        pcVar11 = "B channel not found\n";
      }
      goto LAB_0012820b;
    }
  }
  if (err == (char **)0x0) {
    return -4;
  }
  pcVar11 = "R channel not found\n";
LAB_0012820b:
  *err = pcVar11;
  return -4;
}

Assistant:

int LoadEXRFromMemory(float *out_rgba, const unsigned char *memory,
                      const char **err) {
  if (out_rgba == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.\n";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  EXRVersion exr_version;
  EXRImage exr_image;
  EXRHeader exr_header;

  InitEXRHeader(&exr_header);

  int ret = ParseEXRVersionFromMemory(&exr_version, memory);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  ret = ParseEXRHeaderFromMemory(&exr_header, &exr_version, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  InitEXRImage(&exr_image);
  ret = LoadEXRImageFromMemory(&exr_image, &exr_header, memory, err);
  if (ret != TINYEXR_SUCCESS) {
    return ret;
  }

  // RGBA
  int idxR = -1;
  int idxG = -1;
  int idxB = -1;
  int idxA = -1;
  for (int c = 0; c < exr_header.num_channels; c++) {
    if (strcmp(exr_header.channels[c].name, "R") == 0) {
      idxR = c;
    } else if (strcmp(exr_header.channels[c].name, "G") == 0) {
      idxG = c;
    } else if (strcmp(exr_header.channels[c].name, "B") == 0) {
      idxB = c;
    } else if (strcmp(exr_header.channels[c].name, "A") == 0) {
      idxA = c;
    }
  }

  if (idxR == -1) {
    if (err) {
      (*err) = "R channel not found\n";
    }

    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxG == -1) {
    if (err) {
      (*err) = "G channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  if (idxB == -1) {
    if (err) {
      (*err) = "B channel not found\n";
    }
    // @todo { free exr_image }
    return TINYEXR_ERROR_INVALID_DATA;
  }

  // Assume `out_rgba` have enough memory allocated.
  for (int i = 0; i < exr_image.width * exr_image.height; i++) {
    out_rgba[4 * i + 0] = reinterpret_cast<float **>(exr_image.images)[idxR][i];
    out_rgba[4 * i + 1] = reinterpret_cast<float **>(exr_image.images)[idxG][i];
    out_rgba[4 * i + 2] = reinterpret_cast<float **>(exr_image.images)[idxB][i];
    if (idxA > 0) {
      out_rgba[4 * i + 3] =
          reinterpret_cast<float **>(exr_image.images)[idxA][i];
    } else {
      out_rgba[4 * i + 3] = 1.0;
    }
  }

  return TINYEXR_SUCCESS;
}